

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

bool __thiscall
FirewirePort::ReadQuadletNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *data,uchar param_4)

{
  int iVar1;
  __uint32_t _Var2;
  bool ret;
  allocator<char> local_59;
  string local_58 [39];
  uchar local_31;
  quadlet_t *pqStack_30;
  uchar param_4_local;
  quadlet_t *data_local;
  nodeaddr_t addr_local;
  FirewirePort *pFStack_18;
  nodeid_t node_local;
  FirewirePort *this_local;
  
  local_31 = param_4;
  pqStack_30 = data;
  data_local = (quadlet_t *)addr;
  addr_local._6_2_ = node;
  pFStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"FirewirePort::ReadQuadlet",&local_59)
  ;
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_58,0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    iVar1 = raw1394_read(this->handle,this->baseNodeId + addr_local._6_2_,data_local,4,pqStack_30);
    this_local._7_1_ = iVar1 == 0;
    if (this_local._7_1_) {
      _Var2 = __bswap_32(*pqStack_30);
      *pqStack_30 = _Var2;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FirewirePort::ReadQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t &data, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::ReadQuadlet"))
        return false;

    bool ret = !raw1394_read(handle, baseNodeId+node, addr, 4, &data);
    if (ret)
        data = bswap_32(data);
    return ret;
}